

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_test.c
# Opt level: O0

double GetWallClock(void)

{
  timeval tp;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  return (double)local_10.tv_sec + (double)local_10.tv_usec / 1000000.0;
}

Assistant:

double GetWallClock()
{
#ifdef WIN32
   struct __timeb64 tb;
   _ftime64(&tb);
   return((double)tb.time + (double)tb.millitm/1000.);
#else
   struct timeval tp;
   gettimeofday(&tp, NULL);
   return(tp.tv_sec + tp.tv_usec / 1000000.);
#endif
}